

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LitEnc_EncodeMatched(CRangeEnc *p,UInt16 *probs,UInt32 symbol,UInt32 matchByte)

{
  uint uVar1;
  uint in_ECX;
  uint in_EDX;
  CRangeEnc *in_RSI;
  UInt32 offs;
  uint symbol_00;
  
  symbol_00 = 0x100;
  uVar1 = in_EDX | 0x100;
  do {
    in_ECX = in_ECX << 1;
    RangeEnc_EncodeBit(in_RSI,(UInt16 *)CONCAT44(uVar1,in_ECX),symbol_00);
    uVar1 = uVar1 << 1;
    symbol_00 = (in_ECX ^ uVar1 ^ 0xffffffff) & symbol_00;
  } while (uVar1 < 0x10000);
  return;
}

Assistant:

static void LitEnc_EncodeMatched(CRangeEnc* p, CLzmaProb* probs, UInt32 symbol, UInt32 matchByte) {
  UInt32 offs = 0x100;
  symbol |= 0x100;
  do {
    matchByte <<= 1;
    RangeEnc_EncodeBit(p, probs + (offs + (matchByte & offs) + (symbol >> 8)), (symbol >> 7) & 1);
    symbol <<= 1;
    offs &= ~(matchByte ^ symbol);
  } while (symbol < 0x10000);
}